

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O2

int CVodeResizeHistory(void *cvode_mem,sunrealtype *t_hist,N_Vector *y_hist,N_Vector *f_hist,
                      int num_y_hist,int num_f_hist)

{
  N_Vector *pp_Var1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  SUNNonlinearSolver NLS;
  N_Vector p_Var7;
  ulong uVar8;
  int iVar9;
  int i_1;
  uint uVar10;
  char *msgfmt;
  ulong uVar11;
  int i;
  ulong uVar12;
  N_Vector resize_wrk [13];
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar2 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar9 = 0xca;
  }
  else if (t_hist == (sunrealtype *)0x0) {
    msgfmt = "Time history array is NULL";
    iVar2 = -0x16;
    iVar9 = 0xd1;
  }
  else if (y_hist == (N_Vector *)0x0) {
    msgfmt = "State history array is NULL";
    iVar2 = -0x16;
    iVar9 = 0xd8;
  }
  else if (f_hist == (N_Vector *)0x0) {
    msgfmt = "RHS history array is NULL";
    iVar2 = -0x16;
    iVar9 = 0xdf;
  }
  else {
    uVar10 = *(int *)((long)cvode_mem + 0x120) + 1;
    if ((int)*(uint *)((long)cvode_mem + 0x2c8) <= (int)uVar10) {
      uVar10 = *(uint *)((long)cvode_mem + 0x2c8);
    }
    if (*(int *)((long)cvode_mem + 0x20) == 1) {
      if (num_y_hist < 2) {
        msgfmt = "Insufficient solution history";
        iVar2 = -0x16;
        iVar9 = 0xeb;
      }
      else {
        uVar12 = 0;
        uVar8 = 0;
        if (0 < (int)uVar10) {
          uVar8 = (ulong)uVar10;
        }
        do {
          if (uVar8 == uVar12) goto LAB_00116e75;
          pp_Var1 = f_hist + uVar12;
          uVar12 = uVar12 + 1;
        } while (*pp_Var1 != (N_Vector)0x0);
        msgfmt = "Insufficient right-hand side history";
        iVar2 = -0x16;
        iVar9 = 0xf4;
      }
    }
    else if (num_f_hist < 2) {
      msgfmt = "Insufficient right-hand side history";
      iVar2 = -0x16;
      iVar9 = 0xfe;
    }
    else {
      uVar12 = 0;
      uVar8 = 0;
      if (0 < (int)uVar10) {
        uVar8 = (ulong)uVar10;
      }
      do {
        if (uVar8 == uVar12) goto LAB_00116e75;
        pp_Var1 = y_hist + uVar12;
        uVar12 = uVar12 + 1;
      } while (*pp_Var1 != (N_Vector)0x0);
      msgfmt = "Insufficient solution history";
      iVar2 = -0x16;
      iVar9 = 0x107;
    }
  }
  goto LAB_00117429;
LAB_00117249:
  if (uVar12 == uVar8) goto LAB_00117268;
  p_Var7 = (N_Vector)N_VClone(*y_hist);
  resize_wrk[uVar8] = p_Var7;
  if (p_Var7 == (N_Vector)0x0) {
    for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      N_VDestroy(resize_wrk[uVar12]);
    }
    msgfmt = "A vector allocation failed";
    iVar2 = -0x14;
    iVar9 = 0x19e;
    goto LAB_00117429;
  }
  uVar8 = uVar8 + 1;
  goto LAB_00117249;
LAB_00117268:
  iVar2 = *(int *)((long)cvode_mem + 0x20);
  iVar9 = *(int *)((long)cvode_mem + 0x120);
  if (iVar9 < *(int *)((long)cvode_mem + 0x2c8)) {
    if (iVar2 == 1) {
      iVar2 = cvBuildNordsieckArrayAdams
                        (t_hist + 1,y_hist[1],f_hist + 1,resize_wrk,iVar9,
                         *(sunrealtype *)((long)cvode_mem + 0x160),pp_Var1);
    }
    else {
      iVar2 = cvBuildNordsieckArrayBDF
                        (t_hist + 1,y_hist + 1,f_hist[1],resize_wrk,iVar9,
                         *(sunrealtype *)((long)cvode_mem + 0x160),pp_Var1);
    }
    if (iVar2 != 0) {
      msgfmt = "Building the Nordsieck array failed";
      iVar9 = 0x1bb;
      goto LAB_00117429;
    }
    uVar3 = *(uint *)((long)cvode_mem + 0x120);
    uVar5 = *(undefined8 *)((long)cvode_mem + 0xf0);
    N_VScale(0x3ff0000000000000,*(undefined8 *)((long)cvode_mem + 0x60));
    uVar11 = 0;
    uVar8 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar8 = uVar11;
    }
    for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                   *(undefined8 *)((long)cvode_mem + uVar11 * 8 + 0x68),uVar5);
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*y_hist,
                 *(undefined8 *)((long)cvode_mem + 0xf0),
                 *(undefined8 *)
                  ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60));
    iVar2 = *(int *)((long)cvode_mem + 0x20);
  }
  if (iVar2 == 1) {
    iVar2 = cvBuildNordsieckArrayAdams
                      (t_hist,*y_hist,f_hist,resize_wrk,*(int *)((long)cvode_mem + 0x124),
                       *(sunrealtype *)((long)cvode_mem + 0x160),pp_Var1);
  }
  else {
    iVar2 = cvBuildNordsieckArrayBDF
                      (t_hist,y_hist,*f_hist,resize_wrk,*(int *)((long)cvode_mem + 0x124),
                       *(sunrealtype *)((long)cvode_mem + 0x160),pp_Var1);
  }
  if (iVar2 == 0) {
    *(sunrealtype *)((long)cvode_mem + 0x168) = *t_hist;
    lVar4 = 0;
    while (lVar4 + 1 < (long)(int)uVar10) {
      *(double *)((long)cvode_mem + lVar4 * 8 + 0x180) = t_hist[lVar4] - t_hist[lVar4 + 1];
      lVar4 = lVar4 + 1;
    }
    *(undefined4 *)((long)cvode_mem + 0x72c) = 1;
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      N_VDestroy(resize_wrk[uVar8]);
    }
    return 0;
  }
  msgfmt = "Building the Nordsieck array failed";
  iVar9 = 0x1e2;
  goto LAB_00117429;
LAB_00116e75:
  N_VDestroy(*(undefined8 *)((long)cvode_mem + 200));
  lVar4 = N_VClone(*y_hist);
  *(long *)((long)cvode_mem + 200) = lVar4;
  if (lVar4 == 0) {
    msgfmt = "A vector allocation failed";
    iVar2 = -0x14;
    iVar9 = 0x116;
  }
  else {
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xd8));
    lVar4 = N_VClone(*y_hist);
    *(long *)((long)cvode_mem + 0xd8) = lVar4;
    if (lVar4 == 0) {
      msgfmt = "A vector allocation failed";
      iVar2 = -0x14;
      iVar9 = 0x11f;
    }
    else {
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe0));
      lVar4 = N_VClone(*y_hist);
      *(long *)((long)cvode_mem + 0xe0) = lVar4;
      if (lVar4 == 0) {
        msgfmt = "A vector allocation failed";
        iVar2 = -0x14;
        iVar9 = 0x128;
      }
      else {
        N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xe8));
        lVar4 = N_VClone(*y_hist);
        *(long *)((long)cvode_mem + 0xe8) = lVar4;
        if (lVar4 == 0) {
          msgfmt = "A vector allocation failed";
          iVar2 = -0x14;
          iVar9 = 0x131;
        }
        else {
          N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf0));
          lVar4 = N_VClone(*y_hist);
          *(long *)((long)cvode_mem + 0xf0) = lVar4;
          if (lVar4 == 0) {
            msgfmt = "A vector allocation failed";
            iVar2 = -0x14;
            iVar9 = 0x13a;
          }
          else {
            N_VDestroy(*(undefined8 *)((long)cvode_mem + 0xf8));
            lVar4 = N_VClone(*y_hist);
            *(long *)((long)cvode_mem + 0xf8) = lVar4;
            if (lVar4 == 0) {
              msgfmt = "A vector allocation failed";
              iVar2 = -0x14;
              iVar9 = 0x143;
            }
            else {
              N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x100));
              lVar4 = N_VClone(*y_hist);
              *(long *)((long)cvode_mem + 0x100) = lVar4;
              if (lVar4 == 0) {
                msgfmt = "A vector allocation failed";
                iVar2 = -0x14;
                iVar9 = 0x14c;
              }
              else {
                if (*(int *)((long)cvode_mem + 0x468) != 0) {
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x38));
                  uVar5 = N_VClone(*y_hist);
                  *(undefined8 *)((long)cvode_mem + 0x38) = uVar5;
                }
                if (*(int *)((long)cvode_mem + 0x470) != 0) {
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x108));
                  *(undefined4 *)((long)cvode_mem + 0x470) = 0;
                  *(undefined4 *)((long)cvode_mem + 0x58) = 0;
                }
                pp_Var1 = (N_Vector *)((long)cvode_mem + 0x60);
                lVar4 = 0;
                do {
                  if (*(int *)((long)cvode_mem + 0x460) < lVar4) {
                    if ((*(long *)((long)cvode_mem + 0x3d0) != 0) &&
                       (*(int *)((long)cvode_mem + 0x3d8) != 0)) {
                      iVar2 = SUNNonlinSolFree();
                      if (iVar2 != 0) {
                        msgfmt = "Destroying the Newton solver failed";
                        iVar2 = -0x14;
                        iVar9 = 0x175;
                        goto LAB_00117429;
                      }
                      *(undefined8 *)((long)cvode_mem + 0x3d0) = 0;
                      *(undefined4 *)((long)cvode_mem + 0x3d8) = 0;
                      NLS = SUNNonlinSol_Newton(*y_hist,*cvode_mem);
                      if (NLS == (SUNNonlinearSolver)0x0) {
                        msgfmt = "Error creating the Newton solver";
                        iVar2 = -0x14;
                        iVar9 = 0x17f;
                        goto LAB_00117429;
                      }
                      iVar2 = CVodeSetNonlinearSolver(cvode_mem,NLS);
                      if (iVar2 != 0) {
                        SUNNonlinSolFree(NLS);
                        msgfmt = "Error attaching default Newton solver";
                        iVar2 = -0x14;
                        iVar9 = 0x188;
                        goto LAB_00117429;
                      }
                      *(undefined4 *)((long)cvode_mem + 0x3d8) = 1;
                    }
                    iVar2 = *(int *)((long)cvode_mem + 0x124);
                    if (*(int *)((long)cvode_mem + 0x124) < *(int *)((long)cvode_mem + 0x120)) {
                      iVar2 = *(int *)((long)cvode_mem + 0x120);
                    }
                    uVar3 = (uint)(*(int *)((long)cvode_mem + 0x20) == 2) + iVar2;
                    uVar8 = 0;
                    uVar12 = (ulong)uVar3;
                    if ((int)uVar3 < 1) {
                      uVar12 = uVar8;
                    }
                    goto LAB_00117249;
                  }
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar4 * 8 + 0x60));
                  lVar6 = N_VClone(*y_hist);
                  *(long *)((long)cvode_mem + lVar4 * 8 + 0x60) = lVar6;
                  lVar4 = lVar4 + 1;
                } while (lVar6 != 0);
                msgfmt = "A vector allocation failed";
                iVar2 = -0x14;
                iVar9 = 0x166;
              }
            }
          }
        }
      }
    }
  }
LAB_00117429:
  cvProcessError((CVodeMem)cvode_mem,iVar2,iVar9,"CVodeResizeHistory",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_resize.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVodeResizeHistory(void* cvode_mem, sunrealtype* t_hist, N_Vector* y_hist,
                       N_Vector* f_hist, int num_y_hist, int num_f_hist)
{
  int retval = 0;

  /* ------------ *
   * Check inputs *
   * ------------ */

  if (!cvode_mem)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return CV_MEM_NULL;
  }
  CVodeMem cv_mem = (CVodeMem)cvode_mem;

  if (!t_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Time history array is NULL");
    return CV_ILL_INPUT;
  }

  if (!y_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "State history array is NULL");
    return CV_ILL_INPUT;
  }

  if (!f_hist)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "RHS history array is NULL");
    return CV_ILL_INPUT;
  }

  /* Check that the input history is sufficient for the current (next) order */
  int n_hist = SUNMIN(cv_mem->cv_q + 1, cv_mem->cv_qmax);

  if (cv_mem->cv_lmm == CV_ADAMS)
  {
    if (num_y_hist < 2)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     "Insufficient solution history");
      return CV_ILL_INPUT;
    }

    for (int i = 0; i < n_hist; i++)
    {
      if (!f_hist[i])
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       "Insufficient right-hand side history");
        return CV_ILL_INPUT;
      }
    }
  }
  else
  {
    if (num_f_hist < 2)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     "Insufficient right-hand side history");
      return CV_ILL_INPUT;
    }

    for (int i = 0; i < n_hist; i++)
    {
      if (!y_hist[i])
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       "Insufficient solution history");
        return CV_ILL_INPUT;
      }
    }
  }

  /* -------------- *
   * Resize vectors *
   * -------------- */

  N_VDestroy(cv_mem->cv_ewt);
  cv_mem->cv_ewt = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_ewt))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_acor);
  cv_mem->cv_acor = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_acor))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_tempv);
  cv_mem->cv_tempv = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_tempv))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_ftemp);
  cv_mem->cv_ftemp = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_ftemp))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp1);
  cv_mem->cv_vtemp1 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp1))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp2);
  cv_mem->cv_vtemp2 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp2))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  N_VDestroy(cv_mem->cv_vtemp3);
  cv_mem->cv_vtemp3 = N_VClone(y_hist[0]);
  if (!(cv_mem->cv_vtemp3))
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   "A vector allocation failed");
    return CV_MEM_FAIL;
  }

  /* User will need to set a new vector of absolute tolerances */
  if (cv_mem->cv_VabstolMallocDone)
  {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_Vabstol = N_VClone(y_hist[0]);
  }

  /* User will need to set a new constraints vector */
  if (cv_mem->cv_constraintsMallocDone)
  {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet        = SUNFALSE;
  }

  for (int j = 0; j <= cv_mem->cv_qmax_alloc; j++)
  {
    N_VDestroy(cv_mem->cv_zn[j]);
    cv_mem->cv_zn[j] = N_VClone(y_hist[0]);
    if (!(cv_mem->cv_zn[j]))
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "A vector allocation failed");
      return CV_MEM_FAIL;
    }
  }

  /* ----------------------- *
   * Resize nonlinear solver *
   * ----------------------- */

  if (cv_mem->NLS && cv_mem->ownNLS)
  {
    retval = SUNNonlinSolFree(cv_mem->NLS);
    if (retval)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Destroying the Newton solver failed");
      return CV_MEM_FAIL;
    }
    cv_mem->NLS    = NULL;
    cv_mem->ownNLS = SUNFALSE;

    SUNNonlinearSolver NLS = SUNNonlinSol_Newton(y_hist[0], cv_mem->cv_sunctx);
    if (!NLS)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Error creating the Newton solver");
      return CV_MEM_FAIL;
    }

    retval = CVodeSetNonlinearSolver(cv_mem, NLS);
    if (retval)
    {
      SUNNonlinSolFree(NLS);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "Error attaching default Newton solver");
      return CV_MEM_FAIL;
    }
    cv_mem->ownNLS = SUNTRUE;
  }

  /* ----------------------------- *
   * Create workspace for resizing *
   * ----------------------------- */

  N_Vector resize_wrk[L_MAX];

  int wrk_space_size = SUNMAX(cv_mem->cv_q, cv_mem->cv_qprime);
  if (cv_mem->cv_lmm == CV_BDF) { wrk_space_size++; }

  for (int j = 0; j < wrk_space_size; j++)
  {
    resize_wrk[j] = N_VClone(y_hist[0]);
    if (!resize_wrk[j])
    {
      for (int i = 0; i < j; i++) { N_VDestroy(resize_wrk[i]); }
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     "A vector allocation failed");
      return CV_MEM_FAIL;
    }
  }

  /* ------------------------------------------------------------------------ *
   * Construct Nordsieck array at the old time but with the new size to
   * compute correction vector at the new state size.
   * ------------------------------------------------------------------------ */

  if (cv_mem->cv_q < cv_mem->cv_qmax)
  {
    /* Compute z_{n-1} with new history size */
    if (cv_mem->cv_lmm == CV_ADAMS)
    {
      retval = cvBuildNordsieckArrayAdams(t_hist + 1, y_hist[1], f_hist + 1,
                                          resize_wrk, cv_mem->cv_q,
                                          cv_mem->cv_hscale, cv_mem->cv_zn);
    }
    else
    {
      retval = cvBuildNordsieckArrayBDF(t_hist + 1, y_hist + 1, f_hist[1],
                                        resize_wrk, cv_mem->cv_q,
                                        cv_mem->cv_hscale, cv_mem->cv_zn);
    }

    if (retval)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     "Building the Nordsieck array failed");
      return retval;
    }

    /* Get predicted value */
    retval = cvPredictY(cv_mem->cv_q, cv_mem->cv_zn, cv_mem->cv_vtemp1);

    if (retval)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     "Computing the predictor failed");
      return retval;
    }

    /* Resized correction */
    N_VLinearSum(ONE, y_hist[0], -ONE, cv_mem->cv_vtemp1,
                 cv_mem->cv_zn[cv_mem->cv_qmax]);
  }

  /* ----------------------------- *
   * Construct new Nordsieck Array *
   * ----------------------------- */

  if (cv_mem->cv_lmm == CV_ADAMS)
  {
    retval = cvBuildNordsieckArrayAdams(t_hist, y_hist[0], f_hist, resize_wrk,
                                        cv_mem->cv_qprime, cv_mem->cv_hscale,
                                        cv_mem->cv_zn);
  }
  else
  {
    retval = cvBuildNordsieckArrayBDF(t_hist, y_hist, f_hist[0], resize_wrk,
                                      cv_mem->cv_qprime, cv_mem->cv_hscale,
                                      cv_mem->cv_zn);
  }

  if (retval)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Building the Nordsieck array failed");
    return retval;
  }

  /* ------------------- *
   * Update time history *
   * ------------------- */

  /* Ensure internal time and step history match the input history */
  cv_mem->cv_tn = t_hist[0];

  for (int i = 1; i < n_hist; i++)
  {
    cv_mem->cv_tau[i] = t_hist[i - 1] - t_hist[i];
  }

  /* In the next step, perform initialization needed after a resize */
  cv_mem->first_step_after_resize = SUNTRUE;

  /* ------------------------------ *
   * Destroy workspace for resizing *
   * ------------------------------ */

  for (int i = 0; i < wrk_space_size; i++) { N_VDestroy(resize_wrk[i]); }

  return CV_SUCCESS;
}